

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sniff_csv.cpp
# Opt level: O2

string * duckdb::FormatOptions(string *__return_storage_ptr__,string *opt)

{
  char in_DL;
  
  if (opt->_M_string_length == 1) {
    FormatOptions_abi_cxx11_
              (__return_storage_ptr__,(duckdb *)(ulong)(uint)(int)*(opt->_M_dataplus)._M_p,in_DL);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)opt);
  }
  return __return_storage_ptr__;
}

Assistant:

string FormatOptions(string opt) {
	if (opt.size() == 1) {
		return FormatOptions(opt[0]);
	}
	return opt;
}